

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O3

void ST::apply_format<char_const(&)[2]>(format_writer *data,char (*arg0) [2])

{
  int iVar1;
  bool bVar2;
  long lVar3;
  out_of_range *this;
  undefined8 uVar4;
  long lVar5;
  formatter_ref_t formatters [1];
  format_spec spec;
  char (*local_68) [2];
  undefined8 local_60;
  code *local_58;
  code *local_50;
  format_spec local_44;
  
  local_60 = 0;
  local_50 = std::
             _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
             ::_M_manager;
  lVar5 = 0;
  local_68 = arg0;
  while( true ) {
    bVar2 = format_writer::next_format(data);
    if (!bVar2) {
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      return;
    }
    format_writer::parse_format(&local_44,data);
    iVar1 = local_44.arg_index;
    lVar3 = (long)local_44.arg_index + -1;
    if ((long)local_44.arg_index < 0) {
      lVar3 = lVar5;
    }
    if (lVar3 != 0) break;
    if (local_58 == (code *)0x0) {
      uVar4 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar4);
    }
    (*local_50)(&local_68,&local_44,data);
    lVar5 = lVar5 + (ulong)((uint)iVar1 >> 0x1f);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }